

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

int lbinary(lua_State *L)

{
  ulong uVar1;
  luaL_Buffer b;
  
  lua_settop(L,1);
  luaL_buffinit(L,&b);
  if (b.size <= b.n) {
    luaL_prepbuffsize(&b,1);
  }
  uVar1 = b.n + 1;
  b.b[b.n] = '\0';
  if (b.size <= uVar1) {
    b.n = uVar1;
    luaL_prepbuffsize(&b,1);
    uVar1 = b.n;
  }
  b.n = uVar1 + 1;
  b.b[uVar1] = '\x05';
  if (b.size <= b.n) {
    luaL_prepbuffsize(&b,1);
  }
  b.b[b.n] = '\0';
  b.n = b.n + 1;
  luaL_addvalue(&b);
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int
lbinary(lua_State *L) {
	lua_settop(L,1);
	luaL_Buffer b;
	luaL_buffinit(L, &b);
	luaL_addchar(&b, 0);
	luaL_addchar(&b, BSON_BINARY);
	luaL_addchar(&b, 0);	// sub type
	luaL_addvalue(&b);
	luaL_pushresult(&b);

	return 1;
}